

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_lin_cost(OSQPWorkspace *work,c_float *q_new)

{
  long lVar1;
  c_float *in_RSI;
  OSQPTimer *in_RDI;
  c_float cVar2;
  c_int local_8;
  
  if (in_RDI == (OSQPTimer *)0x0) {
    local_8 = _osqp_error(0,(char *)in_RSI);
  }
  else {
    if (in_RDI[7].tic.tv_nsec == 1) {
      in_RDI[7].tic.tv_nsec = 0;
      *(undefined8 *)(in_RDI[6].toc.tv_sec + 0x60) = 0;
    }
    osqp_tic((OSQPTimer *)0x10b784);
    prea_vec_copy(in_RSI,*(c_float **)((in_RDI->tic).tv_sec + 0x20),*(c_int *)(in_RDI->tic).tv_sec);
    if (*(long *)(in_RDI[5].toc.tv_nsec + 0x10) != 0) {
      vec_ew_prod(*(c_float **)(in_RDI[6].tic.tv_sec + 8),*(c_float **)((in_RDI->tic).tv_sec + 0x20)
                  ,*(c_float **)((in_RDI->tic).tv_sec + 0x20),*(c_int *)(in_RDI->tic).tv_sec);
      vec_mult_scalar(*(c_float **)((in_RDI->tic).tv_sec + 0x20),*(c_float *)in_RDI[6].tic.tv_sec,
                      *(c_int *)(in_RDI->tic).tv_sec);
    }
    reset_info((OSQPInfo *)0x10b82c);
    cVar2 = osqp_toc(in_RDI);
    lVar1 = in_RDI[6].toc.tv_sec;
    *(double *)(lVar1 + 0x60) = cVar2 + *(double *)(lVar1 + 0x60);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int osqp_update_lin_cost(OSQPWorkspace *work, const c_float *q_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Replace q by the new vector
  prea_vec_copy(q_new, work->data->q, work->data->n);

  // Scaling
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->D, work->data->q, work->data->q, work->data->n);
    vec_mult_scalar(work->data->q, work->scaling->c, work->data->n);
  }

  // Reset solver information
  reset_info(work->info);

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return 0;
}